

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImGuiWindow::~ImGuiWindow(ImGuiWindow *this)

{
  int *piVar1;
  char *pcVar2;
  void *pvVar3;
  ImGuiColumns *pIVar4;
  ImGuiStoragePair *pIVar5;
  uint *puVar6;
  long lVar7;
  ulong uVar8;
  
  pcVar2 = this->Name;
  if (pcVar2 != (char *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
  }
  if ((this->ColumnsStorage).Size != 0) {
    lVar7 = 0x58;
    uVar8 = 0;
    do {
      pvVar3 = *(void **)((long)&((this->ColumnsStorage).Data)->ID + lVar7);
      if (pvVar3 != (void *)0x0) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pvVar3,GImAllocatorUserData);
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x60;
    } while (uVar8 != (uint)(this->ColumnsStorage).Size);
  }
  ImDrawList::~ImDrawList(&this->DrawListInst);
  pIVar4 = (this->ColumnsStorage).Data;
  if (pIVar4 != (ImGuiColumns *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
  }
  pIVar5 = (this->StateStorage).Data.Data;
  if (pIVar5 != (ImGuiStoragePair *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
  }
  ImGuiWindowTempData::~ImGuiWindowTempData(&this->DC);
  puVar6 = (this->IDStack).Data;
  if (puVar6 != (uint *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(puVar6,GImAllocatorUserData);
  }
  return;
}

Assistant:

ImGuiWindow::~ImGuiWindow()
{
    IM_ASSERT(DrawList == &DrawListInst);
    IM_DELETE(Name);
    for (int i = 0; i != ColumnsStorage.Size; i++)
        ColumnsStorage[i].~ImGuiColumns();
}